

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::makeConnections(CoreBroker *this,string *file)

{
  ConfigType CVar1;
  string_view configString;
  
  configString._M_str = (file->_M_dataplus)._M_p;
  configString._M_len = file->_M_string_length;
  CVar1 = fileops::getConfigType(configString);
  if (CVar1 - TOML_STRING < 2) {
    fileops::makeConnectionsToml<helics::CoreBroker>(this,file);
    return;
  }
  if (CVar1 < TOML_STRING) {
    fileops::makeConnectionsJson<helics::CoreBroker>(this,file);
    return;
  }
  return;
}

Assistant:

void CoreBroker::makeConnections(const std::string& file)
{
    auto type = fileops::getConfigType(file);

    switch (type) {
        case fileops::ConfigType::JSON_FILE:
        case fileops::ConfigType::JSON_STRING:
            fileops::makeConnectionsJson(this, file);
            break;
        case fileops::ConfigType::TOML_FILE:
        case fileops::ConfigType::TOML_STRING:
            fileops::makeConnectionsToml(this, file);
            break;
        case fileops::ConfigType::CMD_LINE:
        case fileops::ConfigType::NONE:
            // with NONE there are default command line and environment possibilities
            break;
    }
}